

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_hash.cc
# Opt level: O2

uint64_t absl::lts_20240722::hash_internal::LowLevelHashLenGt16
                   (void *data,size_t len,uint64_t seed,uint64_t *salt)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong *puVar12;
  uint64_t uVar13;
  
  uVar13 = seed ^ *salt;
  uVar10 = len;
  puVar11 = (ulong *)data;
  puVar12 = (ulong *)data;
  uVar8 = uVar13;
  uVar9 = uVar13;
  uVar7 = uVar13;
  if (0x40 < len) {
    do {
      uVar1 = puVar11[2];
      uVar2 = puVar11[4];
      uVar3 = puVar11[3];
      uVar4 = puVar11[5];
      uVar5 = puVar11[6];
      uVar6 = puVar11[7];
      puVar12 = puVar11 + 8;
      uVar7 = Mix(salt[1] ^ *puVar11,uVar7 ^ puVar11[1]);
      uVar8 = Mix(uVar1 ^ salt[2],uVar8 ^ uVar3);
      uVar9 = Mix(uVar2 ^ salt[3],uVar9 ^ uVar4);
      uVar13 = Mix(uVar5 ^ salt[4],uVar13 ^ uVar6);
      uVar10 = uVar10 - 0x40;
      puVar11 = puVar12;
    } while (0x40 < uVar10);
    uVar13 = uVar13 + uVar9 ^ uVar7 ^ uVar8;
  }
  if (0x20 < uVar10) {
    uVar1 = puVar12[2];
    uVar2 = puVar12[3];
    uVar8 = Mix(salt[1] ^ *puVar12,puVar12[1] ^ uVar13);
    uVar13 = Mix(uVar1 ^ salt[2],uVar13 ^ uVar2);
    uVar13 = uVar13 ^ uVar8;
    puVar12 = puVar12 + 4;
    uVar10 = uVar10 - 0x20;
  }
  if (0x10 < uVar10) {
    uVar13 = Mix(salt[1] ^ *puVar12,uVar13 ^ puVar12[1]);
  }
  uVar8 = Mix(*(ulong *)((long)data + (len - 0x10)) ^ salt[1] ^ len,
              uVar13 ^ *(ulong *)((long)data + (len - 8)));
  return uVar8;
}

Assistant:

uint64_t LowLevelHashLenGt16(const void* data, size_t len, uint64_t seed,
                             const uint64_t salt[5]) {
  // Prefetch the cacheline that data resides in.
  PrefetchToLocalCache(data);
  const uint8_t* ptr = static_cast<const uint8_t*>(data);
  uint64_t starting_length = static_cast<uint64_t>(len);
  const uint8_t* last_16_ptr = ptr + starting_length - 16;
  uint64_t current_state = seed ^ salt[0];

  if (len > 64) {
    // If we have more than 64 bytes, we're going to handle chunks of 64
    // bytes at a time. We're going to build up two separate hash states
    // which we will then hash together.
    uint64_t duplicated_state0 = current_state;
    uint64_t duplicated_state1 = current_state;
    uint64_t duplicated_state2 = current_state;

    do {
      // Always prefetch the next cacheline.
      PrefetchToLocalCache(ptr + ABSL_CACHELINE_SIZE);

      uint64_t a = absl::base_internal::UnalignedLoad64(ptr);
      uint64_t b = absl::base_internal::UnalignedLoad64(ptr + 8);
      uint64_t c = absl::base_internal::UnalignedLoad64(ptr + 16);
      uint64_t d = absl::base_internal::UnalignedLoad64(ptr + 24);
      uint64_t e = absl::base_internal::UnalignedLoad64(ptr + 32);
      uint64_t f = absl::base_internal::UnalignedLoad64(ptr + 40);
      uint64_t g = absl::base_internal::UnalignedLoad64(ptr + 48);
      uint64_t h = absl::base_internal::UnalignedLoad64(ptr + 56);

      current_state = Mix(a ^ salt[1], b ^ current_state);
      duplicated_state0 = Mix(c ^ salt[2], d ^ duplicated_state0);

      duplicated_state1 = Mix(e ^ salt[3], f ^ duplicated_state1);
      duplicated_state2 = Mix(g ^ salt[4], h ^ duplicated_state2);

      ptr += 64;
      len -= 64;
    } while (len > 64);

    current_state = (current_state ^ duplicated_state0) ^
                    (duplicated_state1 + duplicated_state2);
  }

  // We now have a data `ptr` with at most 64 bytes and the current state
  // of the hashing state machine stored in current_state.
  if (len > 32) {
    uint64_t a = absl::base_internal::UnalignedLoad64(ptr);
    uint64_t b = absl::base_internal::UnalignedLoad64(ptr + 8);
    uint64_t c = absl::base_internal::UnalignedLoad64(ptr + 16);
    uint64_t d = absl::base_internal::UnalignedLoad64(ptr + 24);

    uint64_t cs0 = Mix(a ^ salt[1], b ^ current_state);
    uint64_t cs1 = Mix(c ^ salt[2], d ^ current_state);
    current_state = cs0 ^ cs1;

    ptr += 32;
    len -= 32;
  }

  // We now have a data `ptr` with at most 32 bytes and the current state
  // of the hashing state machine stored in current_state.
  if (len > 16) {
    uint64_t a = absl::base_internal::UnalignedLoad64(ptr);
    uint64_t b = absl::base_internal::UnalignedLoad64(ptr + 8);

    current_state = Mix(a ^ salt[1], b ^ current_state);
  }

  // We now have a data `ptr` with at least 1 and at most 16 bytes. But we can
  // safely read from `ptr + len - 16`.
  uint64_t a = absl::base_internal::UnalignedLoad64(last_16_ptr);
  uint64_t b = absl::base_internal::UnalignedLoad64(last_16_ptr + 8);

  return Mix(a ^ salt[1] ^ starting_length, b ^ current_state);
}